

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O2

logical pnga_patch_intersect(Integer *lo,Integer *hi,Integer *lop,Integer *hip,Integer ndim)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  
  if (ndim < 1) {
    ndim = 0;
  }
  lVar3 = 0;
  while( true ) {
    if (ndim == lVar3) {
      lVar3 = 0;
      do {
        if (ndim == lVar3) {
          for (lVar3 = 0; ndim != lVar3; lVar3 = lVar3 + 1) {
            lVar4 = lop[lVar3];
            if (lop[lVar3] < lo[lVar3]) {
              lVar4 = lo[lVar3];
            }
            lop[lVar3] = lVar4;
            lVar4 = hip[lVar3];
            if (hi[lVar3] < hip[lVar3]) {
              lVar4 = hi[lVar3];
            }
            hip[lVar3] = lVar4;
          }
          return 1;
        }
      } while ((lop[lVar3] <= hi[lVar3]) &&
              (plVar1 = hip + lVar3, plVar2 = lo + lVar3, lVar3 = lVar3 + 1, *plVar2 <= *plVar1));
      return 0;
    }
    if (hi[lVar3] < lo[lVar3]) break;
    plVar1 = hip + lVar3;
    plVar2 = lop + lVar3;
    lVar3 = lVar3 + 1;
    if (*plVar1 < *plVar2) {
      return 0;
    }
  }
  return 0;
}

Assistant:

logical pnga_patch_intersect(Integer *lo, Integer *hi,
                        Integer *lop, Integer *hip, Integer ndim)
{
    Integer i;
    
    /* check consistency of patch coordinates */
    for(i=0; i<ndim; i++) {
        if(hi[i] < lo[i]) return FALSE; /* inconsistent */
        if(hip[i] < lop[i]) return FALSE; /* inconsistent */
    }
    
    /* find the intersection and update (ilop: ihip, jlop: jhip) */
    for(i=0; i<ndim; i++) {
        if(hi[i] < lop[i]) return FALSE; /* don't intersect */
        if(hip[i] < lo[i]) return FALSE; /* don't intersect */
    }
    
    for(i=0; i<ndim; i++) {
        lop[i] = GA_MAX(lo[i], lop[i]);
        hip[i] = GA_MIN(hi[i], hip[i]);
    }
    
    return TRUE;
}